

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_aam_x86_64(CPUX86State *env,int base)

{
  uint uVar1;
  int iVar2;
  int ah;
  int al;
  int base_local;
  CPUX86State *env_local;
  
  uVar1 = (uint)env->regs[0] & 0xff;
  iVar2 = (int)uVar1 % base;
  env->regs[0] = env->regs[0] & 0xffffffffffff0000 | (long)iVar2 | (long)((int)uVar1 / base << 8);
  env->cc_dst = (long)iVar2;
  return;
}

Assistant:

void helper_aam(CPUX86State *env, int base)
{
    int al, ah;

    al = env->regs[R_EAX] & 0xff;
    ah = al / base;
    al = al % base;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | al | (ah << 8);
    CC_DST = al;
}